

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecClass.c
# Opt level: O2

int Cec_ManSimClassesPrepare(Cec_ManSim_t *p,int LevelMax)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  Gia_Rpr_t *pGVar5;
  int *piVar6;
  Gia_Obj_t *pGVar7;
  Cec_ParSim_t *pCVar8;
  int iVar9;
  int nCapMin;
  Vec_Int_t *pVVar10;
  long lVar11;
  Gia_Man_t *pGVar12;
  float Mem;
  
  pGVar12 = p->pAig;
  if (pGVar12->pReprs != (Gia_Rpr_t *)0x0) {
    __assert_fail("p->pAig->pReprs == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/cec/cecClass.c"
                  ,0x357,"int Cec_ManSimClassesPrepare(Cec_ManSim_t *, int)");
  }
  iVar9 = pGVar12->nObjs;
  pGVar5 = (Gia_Rpr_t *)calloc((long)iVar9,4);
  pGVar12->pReprs = pGVar5;
  piVar6 = (int *)calloc((long)iVar9,4);
  pGVar12->pNexts = piVar6;
  Gia_ManCreateValueRefs(pGVar12);
  if (p->pPars->fLatchCorr == 0) {
    if (LevelMax == -1) {
      iVar9 = 0;
      while ((iVar9 < p->pAig->nObjs &&
             (pGVar7 = Gia_ManObj(p->pAig,iVar9), pGVar7 != (Gia_Obj_t *)0x0))) {
        iVar4 = 0xfffffff;
        if ((~*(uint *)pGVar7 & 0x1fffffff) != 0) {
          iVar4 = 0;
        }
        if ((int)*(uint *)pGVar7 < 0) {
          iVar4 = 0xfffffff;
        }
        Gia_ObjSetRepr(p->pAig,iVar9,iVar4);
        iVar9 = iVar9 + 1;
      }
    }
    else {
      Gia_ManLevelNum(p->pAig);
      for (iVar9 = 0; pGVar12 = p->pAig, iVar9 < pGVar12->nObjs; iVar9 = iVar9 + 1) {
        pGVar7 = Gia_ManObj(pGVar12,iVar9);
        pGVar12 = p->pAig;
        if (pGVar7 == (Gia_Obj_t *)0x0) break;
        iVar4 = 0xfffffff;
        if ((~*(uint *)pGVar7 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar7) {
          iVar3 = Gia_ObjId(pGVar12,pGVar7);
          pVVar10 = pGVar12->vLevels;
          iVar4 = pVVar10->nSize;
          if (iVar4 <= iVar3) {
            iVar1 = iVar3 + 1;
            iVar2 = pVVar10->nCap * 2;
            nCapMin = iVar1;
            if ((iVar2 <= iVar3) || (nCapMin = iVar2, pVVar10->nCap <= iVar3)) {
              Vec_IntGrow(pVVar10,nCapMin);
              iVar4 = pVVar10->nSize;
            }
            for (lVar11 = (long)iVar4; lVar11 < iVar1; lVar11 = lVar11 + 1) {
              pVVar10->pArray[lVar11] = 0;
            }
            pVVar10->nSize = iVar1;
          }
          iVar3 = Vec_IntEntry(pVVar10,iVar3);
          iVar4 = 0;
          if (LevelMax < iVar3) {
            iVar4 = 0xfffffff;
          }
        }
        Gia_ObjSetRepr(pGVar12,iVar9,iVar4);
      }
      pVVar10 = pGVar12->vLevels;
      if (pVVar10 != (Vec_Int_t *)0x0) {
        if (pVVar10->pArray != (int *)0x0) {
          free(pVVar10->pArray);
          pGVar12->vLevels->pArray = (int *)0x0;
          pVVar10 = pGVar12->vLevels;
          if (pVVar10 == (Vec_Int_t *)0x0) goto LAB_00518e15;
        }
        free(pVVar10);
        pGVar12->vLevels = (Vec_Int_t *)0x0;
      }
    }
  }
  else {
    lVar11 = 0;
    while ((lVar11 < p->pAig->nObjs &&
           (pGVar7 = Gia_ManObj(p->pAig,(int)lVar11), pGVar7 != (Gia_Obj_t *)0x0))) {
      pGVar5 = p->pAig->pReprs + lVar11;
      *pGVar5 = (Gia_Rpr_t)((uint)*pGVar5 | 0xfffffff);
      lVar11 = lVar11 + 1;
    }
  }
LAB_00518e15:
  pCVar8 = p->pPars;
  if (pCVar8->fSeqSimulate != 0) {
    iVar9 = 0;
    while( true ) {
      pGVar12 = p->pAig;
      if (pGVar12->nRegs <= iVar9) break;
      iVar4 = Vec_IntEntry(pGVar12->vCis,(pGVar12->vCis->nSize - pGVar12->nRegs) + iVar9);
      pGVar7 = Gia_ManObj(pGVar12,iVar4);
      if (pGVar7 == (Gia_Obj_t *)0x0) break;
      if (pGVar7->Value != 0) {
        pGVar12 = p->pAig;
        iVar4 = Gia_ObjId(pGVar12,pGVar7);
        Gia_ObjSetRepr(pGVar12,iVar4,0);
      }
      iVar9 = iVar9 + 1;
    }
    pCVar8 = p->pPars;
  }
  p->nWords = 1;
  do {
    if (pCVar8->fVerbose != 0) {
      pGVar12 = p->pAig;
      Mem = Cec_MemUsage(p);
      Gia_ManEquivPrintClasses(pGVar12,0,Mem);
    }
    iVar9 = 5;
    while (iVar9 = iVar9 + -1, iVar9 != 0) {
      Cec_ManSimCreateInfo(p,p->vCiSimInfo,p->vCoSimInfo);
      iVar4 = Cec_ManSimSimulateRound(p,p->vCiSimInfo,p->vCoSimInfo);
      if (iVar4 != 0) {
        return 1;
      }
    }
    iVar9 = p->nWords;
    p->nWords = iVar9 * 2 + 1;
    pCVar8 = p->pPars;
  } while (iVar9 * 2 < pCVar8->nWords);
  return 0;
}

Assistant:

int Cec_ManSimClassesPrepare( Cec_ManSim_t * p, int LevelMax )
{
    Gia_Obj_t * pObj;
    int i;
    assert( p->pAig->pReprs == NULL );
    // allocate representation
    p->pAig->pReprs = ABC_CALLOC( Gia_Rpr_t, Gia_ManObjNum(p->pAig) );
    p->pAig->pNexts = ABC_CALLOC( int, Gia_ManObjNum(p->pAig) );
    // create references
    Gia_ManCreateValueRefs( p->pAig );
    // set starting representative of internal nodes to be constant 0
    if ( p->pPars->fLatchCorr )
        Gia_ManForEachObj( p->pAig, pObj, i )
            Gia_ObjSetRepr( p->pAig, i, GIA_VOID );
    else if ( LevelMax == -1 )
        Gia_ManForEachObj( p->pAig, pObj, i )
            Gia_ObjSetRepr( p->pAig, i, Gia_ObjIsAnd(pObj) ? 0 : GIA_VOID );
    else
    {
        Gia_ManLevelNum( p->pAig );
        Gia_ManForEachObj( p->pAig, pObj, i )
            Gia_ObjSetRepr( p->pAig, i, (Gia_ObjIsAnd(pObj) && Gia_ObjLevel(p->pAig,pObj) <= LevelMax) ? 0 : GIA_VOID );
        Vec_IntFreeP( &p->pAig->vLevels );
    }
    // if sequential simulation, set starting representative of ROs to be constant 0
    if ( p->pPars->fSeqSimulate )
        Gia_ManForEachRo( p->pAig, pObj, i )
            if ( pObj->Value )
                Gia_ObjSetRepr( p->pAig, Gia_ObjId(p->pAig, pObj), 0 );
    // perform simulation
    p->nWords = 1;
    do {
        if ( p->pPars->fVerbose )
            Gia_ManEquivPrintClasses( p->pAig, 0, Cec_MemUsage(p) );
        for ( i = 0; i < 4; i++ )
        {
            Cec_ManSimCreateInfo( p, p->vCiSimInfo, p->vCoSimInfo );
            if ( Cec_ManSimSimulateRound( p, p->vCiSimInfo, p->vCoSimInfo ) )
                return 1;
        }
        p->nWords = 2 * p->nWords + 1;
    }
    while ( p->nWords <= p->pPars->nWords );
    return 0;
}